

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

string * nite::strRemoveSpaces(string *__return_storage_ptr__,string *Input)

{
  int iVar1;
  ulong uVar2;
  
  while( true ) {
    iVar1 = std::__cxx11::string::find((char *)Input,0x23dfef);
    if (iVar1 == -1) break;
    uVar2 = std::__cxx11::string::find((char *)Input,0x23dfef);
    std::__cxx11::string::erase((ulong)Input,uVar2);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)Input);
  return __return_storage_ptr__;
}

Assistant:

String nite::strRemoveSpaces(String Input){
	while ((signed)Input.find(" ")!=-1){
		Input.erase(Input.find(" "),1);
	}
	return Input;
}